

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRHeaderFromMemory
              (EXRHeader *exr_header,EXRVersion *version,uchar *memory,size_t size,char **err)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  ulong local_1e0;
  size_t i;
  string err_str_1;
  string warn;
  string err_str;
  undefined1 local_170 [4];
  int ret;
  HeaderInfo info;
  size_t marker_size;
  uchar *marker;
  string local_90;
  allocator local_59;
  string local_58;
  char **local_38;
  char **err_local;
  size_t size_local;
  uchar *memory_local;
  EXRVersion *version_local;
  EXRHeader *exr_header_local;
  
  local_38 = err;
  err_local = (char **)size;
  size_local = (size_t)memory;
  memory_local = (uchar *)version;
  version_local = (EXRVersion *)exr_header;
  if ((memory == (uchar *)0x0) || (exr_header == (EXRHeader *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,
               "Invalid argument. `memory` or `exr_header` argument is null in ParseEXRHeaderFromMemory()"
               ,&local_59);
    tinyexr::SetErrorMessage(&local_58,local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    exr_header_local._4_4_ = -3;
  }
  else if (size < 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,"Insufficient header/data size.\n",
               (allocator *)((long)&marker + 7));
    tinyexr::SetErrorMessage(&local_90,local_38);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&marker + 7));
    exr_header_local._4_4_ = -4;
  }
  else {
    info.type.field_2._8_8_ = size - 8;
    tinyexr::HeaderInfo::HeaderInfo((HeaderInfo *)local_170);
    tinyexr::HeaderInfo::clear((HeaderInfo *)local_170);
    std::__cxx11::string::string((string *)(warn.field_2._M_local_buf + 8));
    err_str.field_2._12_4_ =
         tinyexr::ParseEXRHeader
                   ((HeaderInfo *)local_170,(bool *)0x0,(EXRVersion *)memory_local,
                    (string *)(warn.field_2._M_local_buf + 8),memory + 8,info.type.field_2._8_8_);
    if (((err_str.field_2._12_4_ != 0) && (local_38 != (char **)0x0)) &&
       (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      tinyexr::SetErrorMessage((string *)((long)&warn.field_2 + 8),local_38);
    }
    std::__cxx11::string::~string((string *)(warn.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(err_str_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&i);
    bVar1 = tinyexr::ConvertHeader
                      ((EXRHeader *)version_local,(HeaderInfo *)local_170,
                       (string *)(err_str_1.field_2._M_local_buf + 8),(string *)&i);
    if (!bVar1) {
      for (local_1e0 = 0;
          sVar3 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::size
                            ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)
                             &info.channels.
                              super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), local_1e0 < sVar3
          ; local_1e0 = local_1e0 + 1) {
        pvVar4 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                           ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)
                            &info.channels.
                             super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,local_1e0);
        if (pvVar4->value != (uchar *)0x0) {
          pvVar4 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                             ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)
                              &info.channels.
                               super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_1e0);
          free(pvVar4->value);
        }
      }
      if ((local_38 != (char **)0x0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
        tinyexr::SetErrorMessage((string *)&i,local_38);
      }
      err_str.field_2._12_4_ = 0xfffffff7;
    }
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)(err_str_1.field_2._M_local_buf + 8));
    version_local[4].tiled = (uint)(*(int *)(memory_local + 0x10) != 0);
    version_local[4].version = (uint)(*(int *)(memory_local + 0xc) != 0);
    exr_header_local._4_4_ = err_str.field_2._12_4_;
    tinyexr::HeaderInfo::~HeaderInfo((HeaderInfo *)local_170);
  }
  return exr_header_local._4_4_;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRHeader *exr_header, const EXRVersion *version,
                             const unsigned char *memory, size_t size,
                             const char **err) {
  if (memory == NULL || exr_header == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument. `memory` or `exr_header` argument is null in "
        "ParseEXRHeaderFromMemory()",
        err);

    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Insufficient header/data size.\n", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  tinyexr::HeaderInfo info;
  info.clear();

  int ret;
  {
    std::string err_str;
    ret = ParseEXRHeader(&info, NULL, version, &err_str, marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {
      if (err && !err_str.empty()) {
        tinyexr::SetErrorMessage(err_str, err);
      }
    }
  }

  {
    std::string warn;
    std::string err_str;

    if (!ConvertHeader(exr_header, info, &warn, &err_str)) {
      // release mem
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }
      if (err && !err_str.empty()) {
        tinyexr::SetErrorMessage(err_str, err);
      }
      ret = TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  exr_header->multipart = version->multipart ? 1 : 0;
  exr_header->non_image = version->non_image ? 1 : 0;

  return ret;
}